

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_node_equal(mg_node *lhs,mg_node *rhs)

{
  uint uVar1;
  int iVar2;
  uint32_t i;
  ulong uVar3;
  
  if ((lhs->id == rhs->id) && (uVar1 = lhs->label_count, uVar1 == rhs->label_count)) {
    uVar3 = 0;
    do {
      if (uVar1 == uVar3) {
        iVar2 = mg_map_equal(lhs->properties,rhs->properties);
        return iVar2;
      }
      iVar2 = mg_string_equal(lhs->labels[uVar3],rhs->labels[uVar3]);
      uVar3 = uVar3 + 1;
    } while (iVar2 != 0);
  }
  return 0;
}

Assistant:

int mg_node_equal(const mg_node *lhs, const mg_node *rhs) {
  if (lhs->id != rhs->id) {
    return 0;
  }
  if (lhs->label_count != rhs->label_count) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->label_count; ++i) {
    if (!mg_string_equal(lhs->labels[i], rhs->labels[i])) {
      return 0;
    }
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}